

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk-c.cpp
# Opt level: O3

duckdb_data_chunk duckdb_create_data_chunk(duckdb_logical_type *column_types,idx_t column_count)

{
  LogicalType *type;
  bool bVar1;
  Allocator *allocator;
  idx_t iVar2;
  vector<duckdb::LogicalType,_true> types;
  LogicalTypeId local_59;
  DataChunk *local_58;
  anon_class_8_1_50811320 local_50;
  vector<duckdb::LogicalType,_true> local_48;
  
  if (column_types == (duckdb_logical_type *)0x0) {
    local_58 = (DataChunk *)0x0;
  }
  else {
    local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (column_count != 0) {
      local_58 = (DataChunk *)0x0;
      iVar2 = 0;
      do {
        type = (LogicalType *)column_types[iVar2];
        local_59 = INVALID;
        local_50.type_id = &local_59;
        bVar1 = duckdb::TypeVisitor::
                Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                          (type,&local_50);
        if (bVar1) goto LAB_015dd820;
        local_59 = ANY;
        local_50.type_id = &local_59;
        bVar1 = duckdb::TypeVisitor::
                Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                          (type,&local_50);
        if (bVar1) goto LAB_015dd820;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48,
                   type);
        iVar2 = iVar2 + 1;
      } while (column_count != iVar2);
    }
    local_58 = (DataChunk *)operator_new(0x40);
    duckdb::DataChunk::DataChunk(local_58);
    allocator = duckdb::Allocator::DefaultAllocator();
    duckdb::DataChunk::Initialize(local_58,allocator,&local_48,0x800);
LAB_015dd820:
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  }
  return (duckdb_data_chunk)local_58;
}

Assistant:

duckdb_data_chunk duckdb_create_data_chunk(duckdb_logical_type *column_types, idx_t column_count) {
	if (!column_types) {
		return nullptr;
	}
	duckdb::vector<duckdb::LogicalType> types;
	for (idx_t i = 0; i < column_count; i++) {
		auto logical_type = reinterpret_cast<duckdb::LogicalType *>(column_types[i]);
		if (duckdb::TypeVisitor::Contains(*logical_type, duckdb::LogicalTypeId::INVALID) ||
		    duckdb::TypeVisitor::Contains(*logical_type, duckdb::LogicalTypeId::ANY)) {
			return nullptr;
		}
		types.push_back(*logical_type);
	}

	auto result = new duckdb::DataChunk();
	try {
		result->Initialize(duckdb::Allocator::DefaultAllocator(), types);
	} catch (...) {
		delete result;
		return nullptr;
	}

	return reinterpret_cast<duckdb_data_chunk>(result);
}